

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O2

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  size_t __n_00;
  size_t sVar2;
  spdlog_ex *this_00;
  int *piVar3;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,__fd) + 0x250);
  __n_00 = *(size_t *)(lVar1 + 0x10);
  sVar2 = fwrite(*(void **)(lVar1 + 8),1,__n_00,(FILE *)this->_fd);
  if (sVar2 == __n_00) {
    return sVar2;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&bStack_58,(string *)&this->_filename);
  std::operator+(&local_38,"Failed writing to file ",&bStack_58);
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(this_00,&local_38,*piVar3);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

void write(const log_msg &msg)
    {
        size_t msg_size = msg.formatted.size();
        auto data = msg.formatted.data();
        if (std::fwrite(data, 1, msg_size, _fd) != msg_size)
        {
            throw spdlog_ex("Failed writing to file " + os::filename_to_str(_filename), errno);
        }
    }